

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O2

void secp256k1_ge_table_set_globalz(size_t len,secp256k1_ge *a,secp256k1_fe *zr)

{
  size_t sVar1;
  long lVar2;
  secp256k1_fe *psVar3;
  secp256k1_ge *psVar4;
  bool bVar5;
  secp256k1_fe zs;
  secp256k1_fe local_90;
  secp256k1_fe zi2;
  
  sVar1 = len;
  psVar3 = zr;
  psVar4 = a;
  while (bVar5 = sVar1 != 0, sVar1 = sVar1 - 1, bVar5) {
    secp256k1_ge_verify(psVar4);
    secp256k1_fe_verify(psVar3);
    psVar4 = psVar4 + 1;
    psVar3 = psVar3 + 1;
  }
  if (len != 0) {
    secp256k1_fe_normalize_weak(&a[len - 1].y);
    psVar3 = zr + (len - 1);
    zs.n[0] = psVar3->n[0];
    zs.n[1] = zr[len - 1].n[1];
    zs.n[2] = zr[len - 1].n[2];
    zs.n[3] = zr[len - 1].n[3];
    zs.n[4] = zr[len - 1].n[4];
    zs.magnitude = zr[len - 1].magnitude;
    zs.normalized = zr[len - 1].normalized;
    psVar4 = a + (len - 2);
    for (lVar2 = 0; len - 1 != lVar2; lVar2 = lVar2 + 1) {
      if (lVar2 != 0) {
        secp256k1_fe_mul(&zs,&zs,psVar3);
      }
      secp256k1_ge_verify(psVar4);
      secp256k1_fe_verify(&zs);
      if (psVar4->infinity != 0) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/group_impl.h"
                ,0x79,"test condition failed: !a->infinity");
        abort();
      }
      secp256k1_fe_sqr(&zi2,&zs);
      secp256k1_fe_mul(&local_90,&zi2,&zs);
      secp256k1_fe_mul(&psVar4->x,&psVar4->x,&zi2);
      secp256k1_fe_mul(&psVar4->y,&psVar4->y,&local_90);
      secp256k1_ge_verify(psVar4);
      psVar3 = psVar3 + -1;
      psVar4 = psVar4 + -1;
    }
  }
  while (bVar5 = len != 0, len = len - 1, bVar5) {
    secp256k1_ge_verify(a);
    a = a + 1;
  }
  return;
}

Assistant:

static void secp256k1_ge_table_set_globalz(size_t len, secp256k1_ge *a, const secp256k1_fe *zr) {
    size_t i;
    secp256k1_fe zs;
#ifdef VERIFY
    for (i = 0; i < len; i++) {
        SECP256K1_GE_VERIFY(&a[i]);
        SECP256K1_FE_VERIFY(&zr[i]);
    }
#endif

    if (len > 0) {
        i = len - 1;
        /* Ensure all y values are in weak normal form for fast negation of points */
        secp256k1_fe_normalize_weak(&a[i].y);
        zs = zr[i];

        /* Work our way backwards, using the z-ratios to scale the x/y values. */
        while (i > 0) {
            if (i != len - 1) {
                secp256k1_fe_mul(&zs, &zs, &zr[i]);
            }
            i--;
            secp256k1_ge_set_ge_zinv(&a[i], &a[i], &zs);
        }
    }

#ifdef VERIFY
    for (i = 0; i < len; i++) {
        SECP256K1_GE_VERIFY(&a[i]);
    }
#endif
}